

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

Type __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
AddMember<VkPipelineRobustnessBufferBehavior>
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *this,StringRefType *name,VkPipelineRobustnessBufferBehavior value,
          MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  Type pGVar1;
  GenericStringRef<char> local_48;
  undefined1 local_38 [8];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> n;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_local;
  VkPipelineRobustnessBufferBehavior value_local;
  StringRefType *name_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_local;
  
  n.data_.o.members = (Member *)allocator;
  GenericStringRef<char>::GenericStringRef(&local_48,name);
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_38,&local_48);
  pGVar1 = AddMember<VkPipelineRobustnessBufferBehavior>
                     (this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)local_38,value,
                      (MemoryPoolAllocator<rapidjson::CrtAllocator> *)n.data_.o.members);
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_38);
  return pGVar1;
}

Assistant:

AddMember(StringRefType name, T value, Allocator& allocator) {
        GenericValue n(name);
        return AddMember(n, value, allocator);
    }